

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QString * rawMonthName(QString *__return_storage_ptr__,QCalendarLocale *localeData,
                      char16_t *monthsData,int month,FormatType type)

{
  QString *pQVar1;
  ulong uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  DataRange local_10;
  QString *local_8;
  
  local_8 = *(QString **)(in_FS_OFFSET + 0x28);
  if (type == NarrowFormat) {
    uVar2 = (ulong)localeData->m_narrowMonth_idx;
    uVar3 = (ulong)localeData->m_narrowMonth_size;
  }
  else if (type == ShortFormat) {
    uVar2 = (ulong)localeData->m_shortMonth_idx;
    uVar3 = (ulong)localeData->m_shortMonth_size;
  }
  else {
    if (type != LongFormat) {
      pQVar1 = *(QString **)(in_FS_OFFSET + 0x28);
      if (pQVar1 == local_8) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return pQVar1;
      }
      goto LAB_0030e431;
    }
    uVar2 = (ulong)localeData->m_longMonth_idx;
    uVar3 = (ulong)localeData->m_longMonth_size;
  }
  local_10 = (DataRange)(uVar3 << 0x20 | uVar2);
  QLocaleData::DataRange::getListEntry
            (__return_storage_ptr__,&local_10,monthsData,(long)(month + -1));
  if (*(QString **)(in_FS_OFFSET + 0x28) == local_8) {
    return *(QString **)(in_FS_OFFSET + 0x28);
  }
LAB_0030e431:
  __stack_chk_fail();
}

Assistant:

static QString rawMonthName(const QCalendarLocale &localeData,
                            const char16_t *monthsData, int month,
                            QLocale::FormatType type)
{
    QLocaleData::DataRange range;
    switch (type) {
    case QLocale::LongFormat:
        range = localeData.longMonth();
        break;
    case QLocale::ShortFormat:
        range = localeData.shortMonth();
        break;
    case QLocale::NarrowFormat:
        range = localeData.narrowMonth();
        break;
    default:
        return QString();
    }
    return range.getListEntry(monthsData, month - 1);
}